

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O1

char * __thiscall
sisl::body_centered_cubic<char>::operator()
          (body_centered_cubic<char> *this,int d0,__va_list_tag *vl)

{
  uint uVar1;
  uint uVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar3;
  uint *puVar4;
  undefined4 extraout_var;
  
  uVar1 = vl->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar4 = (uint *)((ulong)uVar1 + (long)vl->reg_save_area);
    vl->gp_offset = uVar1 + 8;
  }
  else {
    puVar4 = (uint *)vl->overflow_arg_area;
    vl->overflow_arg_area = puVar4 + 2;
  }
  uVar1 = *puVar4;
  uVar2 = vl->gp_offset;
  if ((ulong)uVar2 < 0x29) {
    puVar4 = (uint *)((ulong)uVar2 + (long)vl->reg_save_area);
    vl->gp_offset = uVar2 + 8;
  }
  else {
    puVar4 = (uint *)vl->overflow_arg_area;
    vl->overflow_arg_area = puVar4 + 2;
  }
  UNRECOVERED_JUMPTABLE = (this->super_base_lattice<char>)._vptr_base_lattice[1];
  iVar3 = (*UNRECOVERED_JUMPTABLE)(this,d0,(ulong)uVar1,(ulong)*puVar4,UNRECOVERED_JUMPTABLE);
  return (char *)CONCAT44(extraout_var,iVar3);
}

Assistant:

virtual const T& operator()(int d0, va_list vl) const {
            int _x = d0, _y = 0, _z = 0;
            int ax, ay, az;

            _y = va_arg(vl, int);
            _z = va_arg(vl, int);

            return this->operator()(_x, _y, _z);
        }